

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O0

int run_test_udp_send_unix(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop_00;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int r;
  int fd;
  uv_buf_t buf;
  uv_loop_t *loop;
  uv_udp_send_t req;
  uv_udp_t handle;
  char cStack_70;
  char cStack_6f;
  sockaddr_un addr;
  
  auVar4 = uv_buf_init("PING");
  buf.base = auVar4._8_8_;
  _r = auVar4._0_8_;
  buf.len = uv_default_loop();
  memset((void *)((long)handle.write_completed_queue + 10),0,0x6e);
  handle.write_completed_queue[1]._2_2_ = 1;
  handle.write_completed_queue[1]._4_1_ = '/';
  handle.write_completed_queue[1]._5_1_ = 't';
  handle.write_completed_queue[1]._6_1_ = 'm';
  handle.write_completed_queue[1]._7_1_ = 'p';
  cStack_70 = '/';
  cStack_6f = 'u';
  addr.sun_family._0_1_ = 'v';
  addr.sun_family._1_1_ = '-';
  iVar1 = socket(1,1,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
            ,0x142,"fd >= 0");
    abort();
  }
  unlink("/tmp/uv-test-sock");
  iVar2 = bind(iVar1,(sockaddr *)((long)handle.write_completed_queue + 10),0x6e);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
            ,0x145,"0 == bind(fd, (const struct sockaddr*)&addr, sizeof addr)");
    abort();
  }
  iVar2 = listen(iVar1,1);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
            ,0x146,"0 == listen(fd, 1)");
    abort();
  }
  iVar2 = uv_udp_init(buf.len,&req.bufsml[3].len);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
            ,0x149,"r == 0");
    abort();
  }
  iVar2 = uv_udp_open(&req.bufsml[3].len,iVar1);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
            ,0x14b,"r == 0");
    abort();
  }
  uv_run(buf.len,0);
  iVar2 = uv_udp_send(&loop,&req.bufsml[3].len,&r,1,
                      (undefined1 *)((long)handle.write_completed_queue + 10),0);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
            ,0x154,"r == 0");
    abort();
  }
  uv_close(&req.bufsml[3].len,0);
  uv_run(buf.len,0);
  close(iVar1);
  unlink("/tmp/uv-test-sock");
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-open.c"
            ,0x15b,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT(strlen(TEST_PIPENAME) < sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(fd >= 0);

  unlink(TEST_PIPENAME);
  ASSERT(0 == bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT(0 == listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT(r == 0);
  r = uv_udp_open(&handle, fd);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY();
  return 0;
}